

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

ssize_t hd_inflate_read_huff
                  (nghttp2_hd_inflater *inflater,nghttp2_buf *buf,uint8_t *in,uint8_t *last)

{
  ulong uVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  bool bVar5;
  
  uVar1 = inflater->left;
  bVar5 = uVar1 <= (ulong)((long)last - (long)in);
  if (bVar5) {
    last = in + uVar1;
  }
  sVar3 = nghttp2_hd_huff_decode
                    (&inflater->huff_decode_ctx,buf,in,(long)last - (long)in,(uint)bVar5);
  sVar4 = sVar3;
  if (-1 < sVar3) {
    iVar2 = nghttp2_hd_huff_decode_failure_state(&inflater->huff_decode_ctx);
    sVar4 = -0x20b;
    if (iVar2 == 0) {
      inflater->left = inflater->left - sVar3;
      sVar4 = sVar3;
    }
  }
  return sVar4;
}

Assistant:

static ssize_t hd_inflate_read_huff(nghttp2_hd_inflater *inflater,
                                    nghttp2_buf *buf, const uint8_t *in,
                                    const uint8_t *last) {
  ssize_t readlen;
  int fin = 0;
  if ((size_t)(last - in) >= inflater->left) {
    last = in + inflater->left;
    fin = 1;
  }
  readlen = nghttp2_hd_huff_decode(&inflater->huff_decode_ctx, buf, in,
                                   (size_t)(last - in), fin);

  if (readlen < 0) {
    DEBUGF("inflatehd: huffman decoding failed\n");
    return readlen;
  }
  if (nghttp2_hd_huff_decode_failure_state(&inflater->huff_decode_ctx)) {
    DEBUGF("inflatehd: huffman decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left -= (size_t)readlen;
  return readlen;
}